

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::updateOrder(Application *this,Order *order,char status)

{
  Application *this_00;
  char status_local;
  FieldBase local_5e0;
  double local_588;
  double local_580;
  double local_578;
  string local_570;
  FieldBase local_550;
  FieldBase local_4f8;
  FieldBase local_4a0;
  FieldBase local_448;
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport fixOrder;
  
  status_local = status;
  FIX::TargetCompID::TargetCompID(&targetCompID,&order->m_owner);
  FIX::SenderCompID::SenderCompID(&senderCompID,&order->m_target);
  FIX::OrderID::OrderID((OrderID *)&local_5e0,&order->m_clientId);
  IDGenerator::genExecutionID_abi_cxx11_(&local_570,&this->m_generator);
  FIX::ExecID::ExecID((ExecID *)&local_550,&local_570);
  FIX::ExecTransType::ExecTransType((ExecTransType *)&local_448,"0812211Application");
  FIX::ExecType::ExecType((ExecType *)&local_4a0,&status_local);
  FIX::OrdStatus::OrdStatus((OrdStatus *)&local_4f8,&status_local);
  this_00 = (Application *)&order->m_symbol;
  FIX::Symbol::Symbol((Symbol *)&local_1e0,(STRING *)this_00);
  convert((Side *)&local_238,this_00,order->m_side);
  local_578 = (double)order->m_openQuantity;
  FIX::LeavesQty::LeavesQty((LeavesQty *)&local_290,&local_578);
  local_580 = (double)order->m_executedQuantity;
  FIX::CumQty::CumQty((CumQty *)&local_2e8,&local_580);
  local_588 = order->m_avgExecutedPrice;
  FIX::AvgPx::AvgPx((AvgPx *)&local_340,&local_588);
  FIX42::ExecutionReport::ExecutionReport
            (&fixOrder,(OrderID *)&local_5e0,(ExecID *)&local_550,(ExecTransType *)&local_448,
             (ExecType *)&local_4a0,(OrdStatus *)&local_4f8,(Symbol *)&local_1e0,(Side *)&local_238,
             (LeavesQty *)&local_290,(CumQty *)&local_2e8,(AvgPx *)&local_340);
  FIX::FieldBase::~FieldBase(&local_340);
  FIX::FieldBase::~FieldBase(&local_2e8);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_4f8);
  FIX::FieldBase::~FieldBase(&local_4a0);
  FIX::FieldBase::~FieldBase(&local_448);
  FIX::FieldBase::~FieldBase(&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  FIX::FieldBase::~FieldBase(&local_5e0);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&local_5e0,&order->m_clientId);
  FIX42::ExecutionReport::set(&fixOrder,(ClOrdID *)&local_5e0);
  FIX::FieldBase::~FieldBase(&local_5e0);
  local_550._vptr_FieldBase = (_func_int **)(double)order->m_quantity;
  FIX::OrderQty::OrderQty((OrderQty *)&local_5e0,(QTY *)&local_550);
  FIX42::ExecutionReport::set(&fixOrder,(OrderQty *)&local_5e0);
  FIX::FieldBase::~FieldBase(&local_5e0);
  if ((byte)(status_local - 0x31U) < 2) {
    local_550._vptr_FieldBase = (_func_int **)(double)order->m_lastExecutedQuantity;
    FIX::LastShares::LastShares((LastShares *)&local_5e0,(QTY *)&local_550);
    FIX42::ExecutionReport::set(&fixOrder,(LastShares *)&local_5e0);
    FIX::FieldBase::~FieldBase(&local_5e0);
    local_550._vptr_FieldBase = (_func_int **)order->m_lastExecutedPrice;
    FIX::LastPx::LastPx((LastPx *)&local_5e0,(PRICE *)&local_550);
    FIX42::ExecutionReport::set(&fixOrder,(LastPx *)&local_5e0);
    FIX::FieldBase::~FieldBase(&local_5e0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"",(allocator<char> *)&local_550);
  FIX::Session::sendToTarget((Message *)&fixOrder,&senderCompID,&targetCompID,(string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  FIX::Message::~Message((Message *)&fixOrder);
  FIX::FieldBase::~FieldBase((FieldBase *)&senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&targetCompID);
  return;
}

Assistant:

void Application::updateOrder(const Order &order, char status) {
  FIX::TargetCompID targetCompID(order.getOwner());
  FIX::SenderCompID senderCompID(order.getTarget());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(order.getClientID()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(status),
      FIX::OrdStatus(status),
      FIX::Symbol(order.getSymbol()),
      FIX::Side(convert(order.getSide())),
      FIX::LeavesQty(order.getOpenQuantity()),
      FIX::CumQty(order.getExecutedQuantity()),
      FIX::AvgPx(order.getAvgExecutedPrice()));

  fixOrder.set(FIX::ClOrdID(order.getClientID()));
  fixOrder.set(FIX::OrderQty(order.getQuantity()));

  if (status == FIX::OrdStatus_FILLED || status == FIX::OrdStatus_PARTIALLY_FILLED) {
    fixOrder.set(FIX::LastShares(order.getLastExecutedQuantity()));
    fixOrder.set(FIX::LastPx(order.getLastExecutedPrice()));
  }

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}